

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O2

bool cmUnsetCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  string *name;
  string *psVar1;
  bool bVar2;
  pointer pbVar3;
  long lVar4;
  pointer pbVar5;
  string_view str;
  allocator<char> local_39;
  char *local_38 [4];
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == name || 0x40 < (ulong)((long)psVar1 - (long)name)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"called with incorrect number of arguments",&local_39);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0027584a:
    std::__cxx11::string::~string((string *)local_38);
    bVar2 = false;
  }
  else {
    str._M_str = (name->_M_dataplus)._M_p;
    str._M_len = name->_M_string_length;
    bVar2 = cmHasLiteralPrefix<5ul>(str,(char (*) [5])"ENV{");
    if ((bVar2) && (5 < name->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)name);
      cmSystemTools::UnsetEnv(local_38[0]);
      std::__cxx11::string::~string((string *)local_38);
    }
    else {
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar4 = (long)pbVar3 - (long)pbVar5 >> 5;
      if (lVar4 == 2) {
        bVar2 = std::operator==(pbVar5 + 1,"CACHE");
        if (!bVar2) {
          pbVar5 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_002757f5;
        }
        cmMakefile::RemoveCacheDefinition(status->Makefile,name);
      }
      else {
        if (lVar4 != 1) {
LAB_002757f5:
          if ((long)pbVar3 - (long)pbVar5 == 0x40) {
            bVar2 = std::operator==(pbVar5 + 1,"PARENT_SCOPE");
            if (bVar2) {
              cmMakefile::RaiseScope(status->Makefile,name,(char *)0x0);
              goto LAB_0027581f;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_38,"called with an invalid second argument",&local_39);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_0027584a;
        }
        cmMakefile::RemoveDefinition(status->Makefile,name);
      }
    }
LAB_0027581f:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmUnsetCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.empty() || args.size() > 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto const& variable = args[0];

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& envVarName = variable.substr(4, variable.size() - 5);

#ifndef CMAKE_BOOTSTRAP
    cmSystemTools::UnsetEnv(envVarName.c_str());
#endif
    return true;
  }
  // unset(VAR)
  if (args.size() == 1) {
    status.GetMakefile().RemoveDefinition(variable);
    return true;
  }
  // unset(VAR CACHE)
  if ((args.size() == 2) && (args[1] == "CACHE")) {
    status.GetMakefile().RemoveCacheDefinition(variable);
    return true;
  }
  // unset(VAR PARENT_SCOPE)
  if ((args.size() == 2) && (args[1] == "PARENT_SCOPE")) {
    status.GetMakefile().RaiseScope(variable, nullptr);
    return true;
  }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  status.SetError("called with an invalid second argument");
  return false;
}